

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O2

string * __thiscall
oout::GtestReportText::asString_abi_cxx11_(string *__return_storage_ptr__,GtestReportText *this)

{
  ostream *poVar1;
  size_t sVar2;
  shared_ptr<const_oout::Result> *result;
  FmtText format;
  ostringstream out;
  CountFailure local_1c0 [2];
  undefined **local_1a0;
  CountTest local_198 [23];
  
  result = &this->result;
  CountTest::CountTest(local_198,result);
  CountTest::count(local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[==========] Running ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," tests");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1a0 = &PTR__Format_00129ac0;
  (*((result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Result[2])(local_1c0);
  std::operator<<((ostream *)local_198,(string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  poVar1 = std::operator<<((ostream *)local_198,"[==========] ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," tests ran.");
  std::endl<char,std::char_traits<char>>(poVar1);
  CountFailure::CountFailure(local_1c0,result);
  sVar2 = CountFailure::count(local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c0[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  poVar1 = std::operator<<((ostream *)local_198,"[  PASSED  ] ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," test.");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (sVar2 != 0) {
    poVar1 = std::operator<<((ostream *)local_198,"[  FAILED  ] ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," test.");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    poVar1 = std::operator<<(poVar1," FAILED TEST");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string GtestReportText::asString() const
{
	const auto test_count = CountTest(result).count();
	ostringstream out;
	// @todo #82:15min gtest count of test cases. Is it need for me?
	out << "[==========] Running " << test_count << " tests" << endl;
	FmtText format;
	out << result->print(format);
	// @todo #82:15min gtest show total seconds.
	//  I have root suite, and this value show on inner level
	out << "[==========] " << test_count << " tests ran." << endl;

	const auto failure_count = CountFailure(result).count();
	out << "[  PASSED  ] " << test_count - failure_count << " test." << endl;
	if (failure_count > 0) {
		out << "[  FAILED  ] " << failure_count << " test." << endl;
		// @todo #82:15min gtest show list of failure tests.
		//  I can do this with special formatter
		out << failure_count << " FAILED TEST" << endl;
	}
	return out.str();
}